

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O0

ze_result_t __thiscall
tracing_layer::APITracerImp::destroyTracer(APITracerImp *this,zel_tracer_handle_t phTracer)

{
  ze_result_t zVar1;
  APITracer *pAVar2;
  ze_result_t result;
  APITracerImp *tracer;
  zel_tracer_handle_t phTracer_local;
  APITracerImp *this_local;
  
  zVar1 = APITracerContextImp::finalizeDisableImpTracingWait
                    (pGlobalAPITracerContextImp,(APITracerImp *)phTracer);
  if ((zVar1 == ZE_RESULT_SUCCESS) &&
     (pAVar2 = APITracer::fromHandle(phTracer), pAVar2 != (APITracer *)0x0)) {
    (*pAVar2->_vptr_APITracer[1])();
  }
  return zVar1;
}

Assistant:

ze_result_t APITracerImp::destroyTracer(zel_tracer_handle_t phTracer) {

    APITracerImp *tracer = static_cast<APITracerImp *>(phTracer);

    ze_result_t result =
        pGlobalAPITracerContextImp->finalizeDisableImpTracingWait(tracer);
    if (result == ZE_RESULT_SUCCESS) {
        delete tracing_layer::APITracer::fromHandle(phTracer);
    }
    return result;
}